

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerInstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CheckerInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::CheckerInstanceBodySymbol&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,CheckerInstanceBodySymbol *args_2)

{
  string_view name;
  CheckerInstanceSymbol *pCVar1;
  SourceLocation in_RCX;
  size_t in_RDX;
  char *in_RSI;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pCVar1 = (CheckerInstanceSymbol *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = in_RSI;
  name._M_len = in_RDX;
  ast::CheckerInstanceSymbol::CheckerInstanceSymbol
            (*(CheckerInstanceSymbol **)(in_RSI + 8),name,in_RCX,
             *(CheckerInstanceBodySymbol **)in_RSI);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }